

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  
  *(undefined8 *)
   ((long)&this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
           super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2 + 8) = 0x964f80;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr._M_dataplus._M_p = (pointer)0x965070;
  *(undefined8 *)
   &this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 = 0x964fa8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x964fd0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x964ff8;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0x965020;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x965048;
  puVar1 = *(undefined1 **)
            &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x18;
  if (puVar1 != &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
                 super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x38) {
    operator_delete(puVar1);
  }
  *(undefined8 *)
   ((long)&this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
           super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2 + 8) = 0x965428;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr._M_dataplus._M_p = (pointer)0x965478;
  *(undefined8 *)
   &this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 = 0x965450;
  puVar1 = *(undefined1 **)&this[-1].super_IfcTerminatorSymbol.field_0xa8;
  if (puVar1 != &this[-1].super_IfcTerminatorSymbol.field_0xb8) {
    operator_delete(puVar1);
  }
  pvVar2 = *(void **)&this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
                      super_IfcAnnotationOccurrence.field_0x90;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
    return;
  }
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}